

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_sdl2.cpp
# Opt level: O0

void ImGui_ImplSDL2_UpdateGamepadButton
               (ImGui_ImplSDL2_Data *bd,ImGuiIO *io,ImGuiKey key,SDL_GameControllerButton button_no)

{
  undefined8 uVar1;
  ImGuiIO *this;
  ImGuiIO *pIVar2;
  undefined4 in_ECX;
  long in_RDI;
  SDL_GameController *gamepad;
  _SDL_GameController **__end1;
  _SDL_GameController **__begin1;
  ImVector<_SDL_GameController_*> *__range1;
  bool merged_value;
  
  this = (ImGuiIO *)
         ImVector<_SDL_GameController_*>::begin((ImVector<_SDL_GameController_*> *)(in_RDI + 0x80));
  pIVar2 = (ImGuiIO *)
           ImVector<_SDL_GameController_*>::end((ImVector<_SDL_GameController_*> *)(in_RDI + 0x80));
  for (; this != pIVar2; this = (ImGuiIO *)&this->DisplaySize) {
    uVar1._0_4_ = this->ConfigFlags;
    uVar1._4_4_ = this->BackendFlags;
    SDL_GameControllerGetButton(uVar1,in_ECX);
  }
  ImGuiIO::AddKeyEvent(this,(ImGuiKey)((ulong)pIVar2 >> 0x20),SUB81((ulong)pIVar2 >> 0x18,0));
  return;
}

Assistant:

static void ImGui_ImplSDL2_UpdateGamepadButton(ImGui_ImplSDL2_Data* bd, ImGuiIO& io, ImGuiKey key, SDL_GameControllerButton button_no)
{
    bool merged_value = false;
    for (SDL_GameController* gamepad : bd->Gamepads)
        merged_value |= SDL_GameControllerGetButton(gamepad, button_no) != 0;
    io.AddKeyEvent(key, merged_value);
}